

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O3

size_t __thiscall PolicyInformation::SetDataSize(PolicyInformation *this)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  
  uVar1 = (this->policyIdentifier).super_DerBase.cbData;
  lVar3 = 2;
  if ((((0x7f < uVar1) && (lVar3 = 3, 0xff < uVar1)) && (lVar3 = 4, 0xffff < uVar1)) &&
     (((lVar3 = 5, 0xffffff < uVar1 && (lVar3 = 6, uVar1 >> 0x20 != 0)) &&
      (lVar3 = 7, uVar1 >> 0x28 != 0)))) {
    lVar3 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  sVar2 = GetDataSize<PolicyQualifierInfo>(&this->policyQualifiers);
  if (sVar2 == 0) {
    sVar2 = 2;
  }
  sVar2 = sVar2 + lVar3 + uVar1;
  (this->super_DerBase).cbData = sVar2;
  return sVar2;
}

Assistant:

virtual size_t SetDataSize() override
	{
		return (cbData = policyIdentifier.EncodedSize() + GetEncodedSize(policyQualifiers));
	}